

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_has_encrypted_entries(archive *_a)

{
  uint uVar1;
  int format_supports_encryption;
  archive_read *a;
  archive *_a_local;
  
  uVar1 = archive_read_format_capabilities(_a);
  if ((_a == (archive *)0x0) || ((uVar1 & 3) == 0)) {
    _a_local._4_4_ = -2;
  }
  else if ((_a[0x15].archive_format_name == (char *)0x0) ||
          (*(long *)(_a[0x15].archive_format_name + 0x50) == 0)) {
    _a_local._4_4_ = -1;
  }
  else {
    _a_local._4_4_ = (**(code **)(_a[0x15].archive_format_name + 0x50))(_a);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_has_encrypted_entries(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int format_supports_encryption = archive_read_format_capabilities(_a)
			& (ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_DATA | ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_METADATA);

	if (!_a || !format_supports_encryption) {
		/* Format in general doesn't support encryption */
		return ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED;
	}

	/* A reader potentially has read enough data now. */
	if (a->format && a->format->has_encrypted_entries) {
		return (a->format->has_encrypted_entries)(a);
	}

	/* For any other reason we cannot say how many entries are there. */
	return ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;
}